

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O0

int * inform_black_box_parts
                (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,int *box,
                inform_error *err)

{
  _Bool _Var1;
  long *plVar2;
  int *b_00;
  int *series_00;
  long lVar3;
  bool bVar4;
  ulong local_c0;
  size_t i_4;
  size_t p;
  size_t j_1;
  int *subseries;
  int *subbases;
  size_t j;
  size_t k;
  size_t i_3;
  size_t i_2;
  size_t *members;
  size_t i_1;
  int *bases;
  int *partitioned;
  int allocate;
  int x;
  size_t i;
  size_t *sorted_parts;
  size_t nparts_local;
  size_t *parts_local;
  int *b_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  _Var1 = check_arguments(series,l,1,n,b,(size_t *)0x0,(size_t *)0x0,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else if ((parts == (size_t *)0x0) || (nparts == 0)) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EPARTS;
    }
    series_local = (int *)0x0;
  }
  else {
    plVar2 = (long *)malloc(l << 3);
    memcpy(plVar2,parts,l << 3);
    qsort(plVar2,l,8,compare_ints);
    if (*plVar2 == 0) {
      for (_allocate = 1; _allocate < l; _allocate = _allocate + 1) {
        if (((int)plVar2[_allocate] != (int)plVar2[_allocate - 1]) &&
           ((int)plVar2[_allocate] - (int)plVar2[_allocate - 1] != 1)) {
          free(plVar2);
          if (err != (inform_error *)0x0) {
            *err = INFORM_EPARTS;
          }
          return (int *)0x0;
        }
      }
      if (plVar2[l - 1] + 1U == nparts) {
        free(plVar2);
        bVar4 = box == (int *)0x0;
        if ((bVar4) && (box = (int *)malloc(nparts * (n + 1) * 4), box == (int *)0x0)) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          series_local = (int *)0x0;
        }
        else {
          lVar3 = nparts * n;
          if (nparts == l) {
            memcpy(box,series,l * n * 4);
            for (members = (size_t *)0x0; members < l; members = (size_t *)((long)members + 1)) {
              box[(long)(lVar3 + (long)members)] = b[(long)members];
            }
          }
          else {
            plVar2 = (long *)malloc(l << 3);
            if (plVar2 == (long *)0x0) {
              if (bVar4) {
                free(box);
              }
              if (err != (inform_error *)0x0) {
                *err = INFORM_ENOMEM;
              }
              return (int *)0x0;
            }
            for (i_3 = 0; i_3 < l; i_3 = i_3 + 1) {
              plVar2[i_3] = -1;
            }
            for (k = 0; k < nparts; k = k + 1) {
              j = 0;
              for (subbases = (int *)0x0; subbases < l; subbases = (int *)((long)subbases + 1)) {
                if (parts[(long)subbases] == k) {
                  plVar2[j] = (long)subbases;
                  j = j + 1;
                }
              }
              if (j == 1) {
                memcpy(box + n * k,series + n * *plVar2,n << 2);
                box[lVar3 + k] = b[*plVar2];
              }
              else {
                b_00 = (int *)malloc(j * (n + 1) * 4);
                series_00 = b_00 + j;
                if (series_00 == (int *)0x0) {
                  free(plVar2);
                  if (bVar4) {
                    free(box);
                  }
                  if (err != (inform_error *)0x0) {
                    *err = INFORM_ENOMEM;
                  }
                  return (int *)0x0;
                }
                box[lVar3 + k] = 1;
                for (p = 0; p < j; p = p + 1) {
                  b_00[p] = b[plVar2[p]];
                  box[lVar3 + k] = b_00[p] * box[lVar3 + k];
                  for (i_4 = 0; i_4 < n; i_4 = i_4 + 1) {
                    series_00[i_4 + n * p] = series[i_4 + n * plVar2[p]];
                  }
                }
                inform_black_box(series_00,j,1,n,b_00,(size_t *)0x0,(size_t *)0x0,box + n * k,err);
                free(b_00);
                _Var1 = inform_failed(err);
                if (_Var1) {
                  free(plVar2);
                  if (bVar4) {
                    free(box);
                  }
                  return (int *)0x0;
                }
              }
              for (local_c0 = 0; local_c0 < l; local_c0 = local_c0 + 1) {
                plVar2[local_c0] = -1;
              }
            }
            free(plVar2);
          }
          series_local = box;
        }
      }
      else {
        free(plVar2);
        if (err != (inform_error *)0x0) {
          *err = INFORM_EPARTS;
        }
        series_local = (int *)0x0;
      }
    }
    else {
      free(plVar2);
      if (err != (inform_error *)0x0) {
        *err = INFORM_EPARTS;
      }
      series_local = (int *)0x0;
    }
  }
  return series_local;
}

Assistant:

int *inform_black_box_parts(int const *series, size_t l, size_t n, int const *b,
    size_t const *parts, size_t nparts, int *box, inform_error *err)
{
    if (check_arguments(series, l, 1, n, b, NULL, NULL, err))
    {
        return NULL;
    }
    if (parts == NULL || nparts < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
    }
    else
    {
        size_t *sorted_parts = malloc(l * sizeof(size_t));
        memcpy(sorted_parts, parts, l * sizeof(size_t));
        qsort(sorted_parts, l, sizeof(size_t), compare_ints);
        if (sorted_parts[0] != 0)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        for (size_t i = 1; i < l; ++i)
        {
            int x = (int)(sorted_parts[i] - sorted_parts[i-1]);
            if (x != 0 && x != 1)
            {
                free(sorted_parts);
                INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
            }
        }
        if (sorted_parts[l-1] + 1 != nparts)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        free(sorted_parts);
    }

    int allocate = (box == NULL);
    if (allocate)
    {
        box = malloc(nparts * (1 + n) * sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    int *partitioned = box;
    int *bases = partitioned + nparts * n;
    if (nparts == l)
    {
        memcpy(partitioned, series, l * n * sizeof(int));
        for (size_t i = 0; i < l; ++i) bases[i] = b[i];
    }
    else
    {
        size_t *members = malloc(l * sizeof(size_t));
        if (members == NULL)
        {
            if (allocate) free(box);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) members[i] = -1;

        for (size_t i = 0; i < nparts; ++i)
        {
            size_t k = 0;
            for (size_t j = 0; j < l; ++j)
            {
                if (parts[j] == i)
                {
                    members[k++] = j;
                }
            }

            if (k == 1)
            {
                memcpy(partitioned + n*i, series + n*members[0], n*sizeof(int));
                bases[i] = b[members[0]];
            }
            else
            {
                int *subbases = malloc(k * (1 + n) * sizeof(int));
                int *subseries = subbases + k;
                if (subseries == NULL)
                {
                    free(members);
                    if (allocate) free(box);
                    INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                }
                bases[i] = 1;
                for (size_t j = 0; j < k; ++j)
                {
                    subbases[j] = b[members[j]];
                    bases[i] *= subbases[j];
                    for (size_t p = 0; p < n; ++p)
                    {
                        subseries[p + n*j] = series[p + n*members[j]];
                    }
                }
                inform_black_box(subseries, k, 1, n, subbases, NULL, NULL,
                    partitioned + n*i, err);
                free(subbases);
                if (inform_failed(err))
                {
                    free(members);
                    if (allocate) free(box);
                    return NULL;
                }
            }
            for (size_t i = 0; i < l; ++i) members[i] = -1;
        }
        free(members);
    }
    return box;
}